

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O1

void __thiscall CEffects::SkidTrail(CEffects *this,vec2 Pos,vec2 Vel)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  float __x;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar8 [16];
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_88;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_84;
  CParticle local_70;
  long local_20;
  undefined8 uVar3;
  undefined1 auVar6 [16];
  undefined4 uVar7;
  undefined1 extraout_var [12];
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_Add100hz == true) {
    local_70.m_Vel.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
    local_70.m_Vel.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
    local_70.m_Rot = 0.0;
    local_70.m_Rotspeed = 0.0;
    local_70.m_Gravity = 0.0;
    local_70.m_Friction = 0.0;
    local_70.m_FlowAffected = 1.0;
    local_70.m_LifeSpan = 0.0;
    local_70.m_StartSize = 32.0;
    local_70.m_EndSize = 32.0;
    local_70.m_Color.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
    local_70.m_Color.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
    local_70.m_Color.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
    local_70.m_Color.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
    local_70.m_Spr = 5;
    local_70.m_Pos = Pos;
    iVar1 = rand();
    iVar2 = rand();
    auVar8._0_4_ = (float)iVar1 * 4.656613e-10 + -0.5;
    auVar8._4_4_ = (float)iVar2 * 4.656613e-10 + -0.5;
    auVar8._8_8_ = 0;
    __x = auVar8._0_4_ * auVar8._0_4_ + auVar8._4_4_ * auVar8._4_4_;
    if (__x < 0.0) {
      auVar4._0_4_ = sqrtf(__x);
      auVar4._4_12_ = extraout_var;
      uVar3 = auVar4._0_8_;
    }
    else {
      uVar3 = CONCAT44(auVar8._4_4_,SQRT(__x));
    }
    uVar7 = (undefined4)((ulong)uVar3 >> 0x20);
    auVar6._8_4_ = uVar7;
    auVar6._0_8_ = uVar3;
    auVar6._12_4_ = uVar7;
    auVar5._0_4_ = (undefined4)uVar3;
    auVar5._8_8_ = auVar6._8_8_;
    auVar5._4_4_ = auVar5._0_4_;
    auVar8 = divps(auVar8,auVar5);
    local_88 = Vel.field_0;
    aStack_84 = Vel.field_1;
    local_70.m_Vel.field_0.x = auVar8._0_4_ * 50.0 + local_88.x;
    local_70.m_Vel.field_1.y = auVar8._4_4_ * 50.0 + aStack_84.y;
    iVar1 = rand();
    local_70.m_LifeSpan = (float)iVar1 * 4.656613e-10 * 0.5 + 0.5;
    iVar1 = rand();
    local_70.m_EndSize = 0.0;
    local_70.m_StartSize = (float)iVar1 * 4.656613e-10 * 12.0 + 24.0;
    local_70.m_Friction = 0.7;
    iVar1 = rand();
    local_70.m_Gravity = (float)iVar1 * 4.656613e-10 * -500.0;
    local_70.m_Color.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f400000;
    local_70.m_Color.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f400000;
    local_70.m_Color.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f400000;
    local_70.m_Color.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
    CParticles::Add(((this->super_CComponent).m_pClient)->m_pParticles,2,&local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEffects::SkidTrail(vec2 Pos, vec2 Vel)
{
	if(!m_Add100hz)
		return;

	CParticle p;
	p.SetDefault();
	p.m_Spr = SPRITE_PART_SMOKE;
	p.m_Pos = Pos;
	p.m_Vel = Vel + RandomDir()*50.0f;
	p.m_LifeSpan = 0.5f + random_float()*0.5f;
	p.m_StartSize = 24.0f + random_float()*12;
	p.m_EndSize = 0;
	p.m_Friction = 0.7f;
	p.m_Gravity = random_float()*-500.0f;
	p.m_Color = vec4(0.75f,0.75f,0.75f,1.0f);
	m_pClient->m_pParticles->Add(CParticles::GROUP_GENERAL, &p);
}